

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  char *__first;
  size_t sVar1;
  char *__last;
  String *in_stack_ffffffffffffff98;
  LogSeverity severity_local;
  int contextDepth_local;
  int line_local;
  Array<char> local_50;
  char *file_local;
  
  severity_local = severity;
  contextDepth_local = contextDepth;
  line_local = line;
  file_local = file;
  ::std::__cxx11::string::append((char *)&this->text);
  str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
            ((String *)&local_50,(kj *)&file_local,(char **)0x194215,(char (*) [2])&line_local,
             (int *)":+",(char (*) [3])&contextDepth_local,(int *)0x19632d,
             (char (*) [3])&severity_local,(LogSeverity *)0x19632d,(char (*) [3])text,
             in_stack_ffffffffffffff98);
  Array<char>::operator=(&text->content,&local_50);
  Array<char>::~Array(&local_50);
  __first = (text->content).ptr;
  sVar1 = (text->content).size_;
  __last = __first + (sVar1 - 1);
  if (sVar1 == 0) {
    __last = (char *)0x0;
    __first = (char *)0x0;
  }
  ::std::__cxx11::string::append<char*,void>((string *)&this->text,__first,__last);
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
  }